

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

int __thiscall CVmDynFuncVMIfc::validate_pool_list(CVmDynFuncVMIfc *this,uint32_t ofs)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  bVar4 = (byte)G_const_pool_X.super_CVmPoolPaged.log2_page_size_;
  uVar10 = (ulong)(ofs >> (bVar4 & 0x1f));
  iVar2 = 0;
  iVar3 = 0;
  if ((uVar10 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
     (iVar3 = 0, G_const_pool_X.super_CVmPoolPaged.pages_[uVar10].mem != (char *)0x0)) {
    uVar8 = G_const_pool_X.super_CVmPoolPaged._8_4_ - 1;
    uVar5 = (ulong)(uVar8 & ofs);
    iVar3 = iVar2;
    if (uVar5 < G_const_pool_X.super_CVmPoolPaged.pages_[uVar10].siz) {
      uVar7 = (ulong)(ofs + 1 >> (bVar4 & 0x1f));
      if (((uVar7 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
          (G_const_pool_X.super_CVmPoolPaged.pages_[uVar7].mem != (char *)0x0)) &&
         ((ulong)(ofs + 1 & uVar8) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar7].siz)) {
        uVar1 = *(ushort *)(G_const_pool_X.super_CVmPoolPaged.pages_[uVar10].mem + uVar5);
        uVar9 = (uint)uVar1 + (uint)uVar1 * 4 + ofs + 1;
        uVar7 = (ulong)(uVar9 >> (bVar4 & 0x1f));
        if (((uVar7 < G_const_pool_X.super_CVmPoolPaged.page_slots_) &&
            (G_const_pool_X.super_CVmPoolPaged.pages_[uVar7].mem != (char *)0x0)) &&
           (((ulong)(uVar8 & uVar9) < G_const_pool_X.super_CVmPoolPaged.pages_[uVar7].siz &&
            (iVar3 = 1, (ulong)uVar1 != 0)))) {
          lVar6 = 0;
          do {
            if (0x12 < (byte)G_const_pool_X.super_CVmPoolPaged.pages_[uVar10].mem[lVar6 + uVar5 + 2]
               ) {
              return 0;
            }
            lVar6 = lVar6 + 5;
          } while ((ulong)uVar1 * 5 != lVar6);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

virtual int validate_pool_list(uint32_t ofs)
    {
        /* establish globals */
        VMGLOB_PTR(vmg);

        /* validate the starting offset and full length prefix */
        if (!G_const_pool->validate_ofs(ofs)
            || !G_const_pool->validate_ofs(ofs+1))
            return FALSE;

        /* get the length */
        const char *p = G_const_pool->get_ptr(ofs);
        size_t len = vmb_get_len(p);
        p += VMB_LEN;

        /* make sure the end of the string is valid as well */
        if (!G_const_pool->validate_ofs(
            ofs + VMB_LEN + (len*VMB_DATAHOLDER) - 1))
            return FALSE;

        /* validate that each element is valid */
        for ( ; len != 0 ; p += VMB_DATAHOLDER, --len)
        {
            if (*p < 0 || *p >= (int)VM_FIRST_INVALID_TYPE)
                return FALSE;
        }

        /* success */
        return TRUE;
    }